

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctoquadIdentifier.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::OctoquadIdentifier::SetTrigramAlphabet
          (OctoquadIdentifier *this,ScriptContext *scriptContext,char *alpha,char *alphaBits)

{
  char cVar1;
  uint i;
  TrigramAlphabet *this_00;
  long lVar2;
  
  this_00 = (TrigramAlphabet *)
            new<Memory::ArenaAllocator>(0x3378,&scriptContext->regexAllocator,0x35916e);
  for (lVar2 = 0x3204; lVar2 != 0x3284; lVar2 = lVar2 + 1) {
    *(undefined1 *)((long)this_00->trigramStarts[0].patterns + lVar2 + -8) = 4;
  }
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    cVar1 = alpha[lVar2];
    this_00->alpha[lVar2] = cVar1;
    this_00->alphaBits[cVar1] = alphaBits[cVar1];
  }
  TrigramAlphabet::InitTrigramMap(this_00);
  Js::ScriptContext::SetTrigramAlphabet(scriptContext,this_00);
  return;
}

Assistant:

void OctoquadIdentifier::SetTrigramAlphabet(Js::ScriptContext * scriptContext,
        __in_xcount(regex::TrigramAlphabet::AlphaCount) char* alpha
        , __in_xcount(regex::TrigramAlphabet::AsciiTableSize) char* alphaBits)
    {
        ArenaAllocator* alloc = scriptContext->RegexAllocator();
        TrigramAlphabet * trigramAlphabet = AnewStruct(alloc, UnifiedRegex::TrigramAlphabet);
        for (uint i = 0; i < UnifiedRegex::TrigramAlphabet::AsciiTableSize; i++) {
            trigramAlphabet->alphaBits[i] = UnifiedRegex::TrigramAlphabet::BitsNotInAlpha;
        }
        for (uint i = 0; i < UnifiedRegex::TrigramAlphabet::AlphaCount; i++) {
            trigramAlphabet->alpha[i] = alpha[i];
            trigramAlphabet->alphaBits[alpha[i]] = alphaBits[alpha[i]];
        }
        trigramAlphabet->InitTrigramMap();
        scriptContext->SetTrigramAlphabet(trigramAlphabet);
    }